

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O2

void __thiscall
helics::CoreBroker::addDestinationFilterToEndpoint
          (CoreBroker *this,string_view filter,string_view endpoint)

{
  ActionMessage link;
  ActionMessage AStack_e8;
  
  ActionMessage::ActionMessage(&AStack_e8,cmd_filter_link);
  ActionMessage::name(&AStack_e8,(string_view)filter);
  ActionMessage::setStringData(&AStack_e8,(string_view)endpoint);
  AStack_e8.flags._0_1_ = (byte)AStack_e8.flags | 2;
  BrokerBase::addActionMessage(&this->super_BrokerBase,&AStack_e8);
  ActionMessage::~ActionMessage(&AStack_e8);
  return;
}

Assistant:

void CoreBroker::addDestinationFilterToEndpoint(std::string_view filter, std::string_view endpoint)
{
    ActionMessage link(CMD_FILTER_LINK);
    link.name(filter);
    link.setStringData(endpoint);
    setActionFlag(link, destination_target);
    addActionMessage(std::move(link));
}